

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EntityAppearance.cpp
# Opt level: O0

KString * __thiscall
KDIS::DATA_TYPE::EntityAppearance::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,EntityAppearance *this,EntityType *EntType)

{
  byte bVar1;
  EntityKind EVar2;
  EntityDomain EVar3;
  LandPlatformAppearance *this_00;
  AirPlatformAppearance *this_01;
  SurfacePlatformAppearance *this_02;
  SubSurfacePlatformAppearance *this_03;
  SpacePlatformAppearance *this_04;
  GuidedMunitionsAppearance *this_05;
  NonHumanLifeFormAppearance *this_06;
  LifeFormAppearance *this_07;
  EnvironmentalsAppearance *this_08;
  CulturalFeatureAppearance *this_09;
  SensorEmitterAppearance *this_10;
  RadioAppearance *this_11;
  ExpendableAppearance *this_12;
  SupplyAppearance *this_13;
  EntityType *EntType_local;
  EntityAppearance *this_local;
  
  EVar2 = EntityType::GetEntityKind(EntType);
  switch(EVar2) {
  case Platform:
    EVar3 = EntityType::GetDomain(EntType);
    switch(EVar3) {
    case Land:
      this_00 = GetAppearanceAsLandPlatform(this);
      LandPlatformAppearance::GetAsString_abi_cxx11_(__return_storage_ptr__,this_00);
      break;
    case Air:
      this_01 = GetAppearanceAsAirPlatform(this);
      AirPlatformAppearance::GetAsString_abi_cxx11_(__return_storage_ptr__,this_01);
      break;
    case Surface:
      this_02 = GetAppearanceAsSurfacePlatform(this);
      SurfacePlatformAppearance::GetAsString_abi_cxx11_(__return_storage_ptr__,this_02);
      break;
    case Subsurface:
      this_03 = GetAppearanceAsSubsurfacePlatform(this);
      SubSurfacePlatformAppearance::GetAsString_abi_cxx11_(__return_storage_ptr__,this_03);
      break;
    case Space:
      this_04 = GetAppearanceAsSpacePlatform(this);
      SpacePlatformAppearance::GetAsString_abi_cxx11_(__return_storage_ptr__,this_04);
      break;
    default:
      goto switchD_00216c63_caseD_2;
    }
    break;
  case Munition:
switchD_00216c63_caseD_2:
    this_05 = GetAppearanceAsGuidedMuntions(this);
    GuidedMunitionsAppearance::GetAsString_abi_cxx11_(__return_storage_ptr__,this_05);
    break;
  case Lifeform:
    bVar1 = EntityType::GetCategory(EntType);
    if (bVar1 < 200) {
      this_07 = GetAppearanceAsLifeForm(this);
      LifeFormAppearance::GetAsString_abi_cxx11_(__return_storage_ptr__,this_07);
    }
    else {
      this_06 = GetAppearanceAsNonHumanLifeForm(this);
      NonHumanLifeFormAppearance::GetAsString_abi_cxx11_(__return_storage_ptr__,this_06);
    }
    break;
  case Environmental:
    this_08 = GetAppearanceEnvironmentals(this);
    EnvironmentalsAppearance::GetAsString_abi_cxx11_(__return_storage_ptr__,this_08);
    break;
  case Culturalfeature:
    this_09 = GetAppearanceCultural(this);
    CulturalFeatureAppearance::GetAsString_abi_cxx11_(__return_storage_ptr__,this_09);
    break;
  case Supply:
    this_13 = GetAppearanceAsSupply(this);
    SupplyAppearance::GetAsString_abi_cxx11_(__return_storage_ptr__,this_13);
    break;
  case Radio:
    this_11 = GetAppearanceAsRadio(this);
    RadioAppearance::GetAsString_abi_cxx11_(__return_storage_ptr__,this_11);
    break;
  case Expendable:
    this_12 = GetAppearanceAsExpendable(this);
    ExpendableAppearance::GetAsString_abi_cxx11_(__return_storage_ptr__,this_12);
    break;
  case SensorEmitter:
    this_10 = GetSensorEmitter(this);
    SensorEmitterAppearance::GetAsString_abi_cxx11_(__return_storage_ptr__,this_10);
    break;
  default:
    (*(this->super_DataTypeBase)._vptr_DataTypeBase[2])(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

KString EntityAppearance::GetAsString( const EntityType & EntType ) const
{
    switch( EntType.GetEntityKind() ) // Kind
    {
        case Platform:
        switch( EntType.GetDomain() ) // Domain
        {
            case Land:       return GetAppearanceAsLandPlatform().GetAsString();
            case Air:        return GetAppearanceAsAirPlatform().GetAsString();
            case Surface:    return GetAppearanceAsSurfacePlatform().GetAsString();
            case Subsurface: return GetAppearanceAsSubsurfacePlatform().GetAsString();
            case Space:      return GetAppearanceAsSpacePlatform().GetAsString();
        }

        case Munition: return GetAppearanceAsGuidedMuntions().GetAsString();

        case Lifeform:
        {
          if( EntType.GetCategory() >= 200 )  //SISO-REF-010-2016-v22. Lifeform category values 200 and above are non-human.
            return GetAppearanceAsNonHumanLifeForm().GetAsString();
          else
            return GetAppearanceAsLifeForm().GetAsString();
        }

        case Environmental: return GetAppearanceEnvironmentals().GetAsString();

        case Culturalfeature: return GetAppearanceCultural().GetAsString();

        case SensorEmitter: return GetSensorEmitter().GetAsString();

        case Radio: return GetAppearanceAsRadio().GetAsString();

        case Expendable: return GetAppearanceAsExpendable().GetAsString();

        case Supply: return GetAppearanceAsSupply().GetAsString();
    }

    // Fall back
    return GetAsString();
}